

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argengine.cpp
# Opt level: O2

void __thiscall
juzzlin::Argengine::addOption
          (Argengine *this,OptionSet *optionVariants,ValuelessCallback *callback,bool required,
          string *infoText)

{
  _Head_base<0UL,_juzzlin::Argengine::Impl_*,_false> optionVariants_00;
  undefined7 in_register_00000009;
  undefined1 auStack_58 [48];
  
  optionVariants_00._M_head_impl =
       (this->m_impl)._M_t.
       super___uniq_ptr_impl<juzzlin::Argengine::Impl,_std::default_delete<juzzlin::Argengine::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_juzzlin::Argengine::Impl_*,_std::default_delete<juzzlin::Argengine::Impl>_>
       .super__Head_base<0UL,_juzzlin::Argengine::Impl_*,_false>._M_head_impl;
  std::function<void_()>::function((function<void_()> *)(auStack_58 + 0x10),callback);
  Impl::addOption((Impl *)auStack_58,(OptionSet *)optionVariants_00._M_head_impl,
                  (ValuelessCallback *)optionVariants,
                  SUB81((function<void_()> *)(auStack_58 + 0x10),0),
                  (string *)(CONCAT71(in_register_00000009,required) & 0xffffffff));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_58 + 8));
  std::_Function_base::~_Function_base((_Function_base *)(auStack_58 + 0x10));
  return;
}

Assistant:

void Argengine::addOption(OptionSet optionVariants, ValuelessCallback callback, bool required, std::string infoText)
{
    m_impl->addOption(optionVariants, callback, required, infoText);
}